

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O3

void __thiscall Person::set_age(Person *this,size_t age)

{
  recursive_mutex *__mutex;
  int iVar1;
  undefined8 uVar2;
  pointer unaff_R12;
  any local_50;
  string local_40;
  
  __mutex = &this->m_mtx;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    if (this->m_age != age) {
      this->m_age = age;
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"age","");
      local_50._M_manager = std::any::_Manager_internal<unsigned_long>::_S_manage;
      local_50._M_storage = (_Storage)age;
      notify(this,&local_40,&local_50);
      if (local_50._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
        (*local_50._M_manager)(_Op_destroy,&local_50,(_Arg *)0x0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  uVar2 = __clang_call_terminate(uVar2);
  std::any::~any(&local_50);
  if (local_40._M_dataplus._M_p != unaff_R12) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

void set_age(size_t age)
	{
		std::lock_guard<decltype(m_mtx)> lock(m_mtx);

		if(age != m_age)
		{
			m_age = age;
			notify("age", age);
		}
	}